

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O2

uchar PrologEncoderMD::GetXmmRegToSave(Instr *instr,unsigned_short *scaledOffset)

{
  RegNum RVar1;
  RegNum RVar2;
  int iVar3;
  Func *pFVar4;
  code *pcVar5;
  bool bVar6;
  RegNum RVar7;
  undefined4 *puVar8;
  RegOpnd *pRVar9;
  IndirOpnd *pIVar10;
  uint uVar11;
  
  if (scaledOffset == (unsigned_short *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x46,"(scaledOffset)","scaledOffset");
    if (!bVar6) goto LAB_005d2a31;
    *puVar8 = 0;
  }
  if ((instr->m_opcode & ~ExtendedOpcodePrefix) != MOVAPD) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x47,
                       "(instr->m_opcode == Js::OpCode::MOVAPD || instr->m_opcode == Js::OpCode::MOVAPS)"
                       ,
                       "instr->m_opcode == Js::OpCode::MOVAPD || instr->m_opcode == Js::OpCode::MOVAPS"
                      );
    if (!bVar6) goto LAB_005d2a31;
    *puVar8 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
LAB_005d2825:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x48,"(instr->GetDst() && instr->GetDst()->IsIndirOpnd())",
                       "instr->GetDst() && instr->GetDst()->IsIndirOpnd()");
    if (!bVar6) goto LAB_005d2a31;
    *puVar8 = 0;
  }
  else {
    bVar6 = IR::Opnd::IsIndirOpnd(instr->m_dst);
    if (!bVar6) goto LAB_005d2825;
  }
  pRVar9 = IR::Opnd::AsRegOpnd(instr->m_src1);
  RVar1 = pRVar9->m_reg;
  pIVar10 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  iVar3 = pIVar10->m_offset;
  pIVar10 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  RVar2 = pIVar10->m_baseOpnd->m_reg;
  RVar7 = LowererMDArch::GetRegStackPointer();
  if (RVar2 != RVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x50,
                       "(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetReg() == LowererMDArch::GetRegStackPointer())"
                       ,
                       "instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetReg() == LowererMDArch::GetRegStackPointer()"
                      );
    if (!bVar6) goto LAB_005d2a31;
    *puVar8 = 0;
  }
  pFVar4 = instr->m_func->topFunc;
  uVar11 = iVar3 + pFVar4->m_argsSize + pFVar4->m_savedRegSize;
  if ((int)uVar11 < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x55,"(static_cast<int32>(offsetFromInstr) >= 0)",
                       "static_cast<int32>(offsetFromInstr) >= 0");
    if (!bVar6) goto LAB_005d2a31;
    *puVar8 = 0;
  }
  if ((uVar11 + 0xf & 0xfffffff0) != uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x56,
                       "(::Math::Align(offsetFromInstr, static_cast<unsigned int>(MachDouble * 2)) == offsetFromInstr)"
                       ,
                       "::Math::Align(offsetFromInstr, static_cast<unsigned __int32>(MachDouble * 2)) == offsetFromInstr"
                      );
    if (!bVar6) goto LAB_005d2a31;
    *puVar8 = 0;
  }
  if (0xfffff < uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x5d,"((!(((size_t)offsetFromInstr) & ~((size_t)0xFFFF))))",
                       "IS_UINT16(offsetFromInstr)");
    if (!bVar6) {
LAB_005d2a31:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  *scaledOffset = (unsigned_short)(uVar11 >> 4);
  return RVar1 - RegXMM0;
}

Assistant:

unsigned __int8 PrologEncoderMD::GetXmmRegToSave(IR::Instr *instr, unsigned __int16 *scaledOffset)
{
    Assert(scaledOffset);
    Assert(instr->m_opcode == Js::OpCode::MOVAPD || instr->m_opcode == Js::OpCode::MOVAPS);
    Assert(instr->GetDst() && instr->GetDst()->IsIndirOpnd());

    unsigned __int8 reg = ((instr->GetSrc1()->AsRegOpnd()->GetReg() - FIRST_XMM_REG) & 0xFF);
    unsigned __int32 offsetFromInstr = instr->GetDst()->AsIndirOpnd()->GetOffset();

    // The offset in the instruction is relative to the stack pointer before the saved reg size and stack args size were
    // subtracted, but the offset in the unwind info needs to be relative to the final stack pointer value
    // (see LowererMDArch::LowerEntryInstr), so adjust for that
    Assert(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetReg() == LowererMDArch::GetRegStackPointer());
    Func *const topFunc = instr->m_func->GetTopFunc();
    offsetFromInstr += topFunc->GetArgsSize() + topFunc->GetSavedRegSize();

    // Can only encode nonnegative 16-byte-aligned offsets in the unwind info
    Assert(static_cast<int32>(offsetFromInstr) >= 0);
    Assert(::Math::Align(offsetFromInstr, static_cast<unsigned __int32>(MachDouble * 2)) == offsetFromInstr);

    // Stored offset is scaled by 16
    offsetFromInstr /= MachDouble * 2;

    // We currently don't allow a total stack size greater than 1 MB. If we start allowing that, we will need to handle offsets
    // greater than (1 MB - 16) in the unwind info as well, for which a FAR version of the op-code is necessary.
    Assert(IS_UINT16(offsetFromInstr));

    *scaledOffset = TO_UINT16(offsetFromInstr);

    return reg;
}